

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2text_format.cc
# Opt level: O0

bool __thiscall
s2textformat::MakeLoop
          (s2textformat *this,string_view str,unique_ptr<S2Loop,_std::default_delete<S2Loop>_> *loop
          ,S2Debug debug_override)

{
  string_view y;
  string_view x;
  string_view x_00;
  bool bVar1;
  string_view str_00;
  unique_ptr<S2Loop,_std::default_delete<S2Loop>_> local_f8;
  undefined4 local_ec;
  unique_ptr<S2Loop,_std::default_delete<S2Loop>_> *local_e8;
  char *pcStack_e0;
  undefined1 local_d8 [8];
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> vertices;
  unique_ptr<S2Loop,_std::default_delete<S2Loop>_> local_a8;
  string_view local_a0;
  unique_ptr<S2Loop,_std::default_delete<S2Loop>_> *local_90;
  char *local_88;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> local_70;
  unique_ptr<S2Loop,_std::default_delete<S2Loop>_> local_58;
  string_view local_50;
  s2textformat *local_40;
  char *local_38;
  S2Debug local_29;
  unique_ptr<S2Loop,_std::default_delete<S2Loop>_> *puStack_28;
  S2Debug debug_override_local;
  unique_ptr<S2Loop,_std::default_delete<S2Loop>_> *loop_local;
  string_view str_local;
  
  puStack_28 = (unique_ptr<S2Loop,_std::default_delete<S2Loop>_> *)str.length_;
  local_38 = str.ptr_;
  local_29 = (S2Debug)loop;
  local_40 = this;
  loop_local = (unique_ptr<S2Loop,_std::default_delete<S2Loop>_> *)this;
  str_local.ptr_ = local_38;
  absl::string_view::string_view(&local_50,"empty");
  x_00.length_ = (size_type)local_38;
  x_00.ptr_ = (char *)local_40;
  bVar1 = absl::operator==(x_00,local_50);
  if (bVar1) {
    S2Loop::kEmpty();
    absl::make_unique<S2Loop,std::vector<Vector3<double>,std::allocator<Vector3<double>>>>
              ((absl *)&local_58,&local_70);
    std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>::operator=(puStack_28,&local_58);
    std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>::~unique_ptr(&local_58);
    std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::~vector(&local_70);
    str_local.length_._7_1_ = 1;
  }
  else {
    local_90 = loop_local;
    local_88 = str_local.ptr_;
    absl::string_view::string_view(&local_a0,"full");
    x.length_ = (size_type)local_88;
    x.ptr_ = (char *)local_90;
    y.length_ = local_a0.length_;
    y.ptr_ = local_a0.ptr_;
    bVar1 = absl::operator==(x,y);
    if (bVar1) {
      S2Loop::kFull();
      absl::make_unique<S2Loop,std::vector<Vector3<double>,std::allocator<Vector3<double>>>>
                ((absl *)&local_a8,
                 (vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)
                 &vertices.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>::operator=(puStack_28,&local_a8);
      std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>::~unique_ptr(&local_a8);
      std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::~vector
                ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)
                 &vertices.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      str_local.length_._7_1_ = 1;
    }
    else {
      std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::vector
                ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)local_d8);
      local_e8 = loop_local;
      pcStack_e0 = str_local.ptr_;
      str_00.length_ = (size_type)local_d8;
      str_00.ptr_ = str_local.ptr_;
      str_local.length_._7_1_ =
           ParsePoints((s2textformat *)loop_local,str_00,
                       (vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)
                       local_a0.length_);
      if ((bool)str_local.length_._7_1_) {
        absl::
        make_unique<S2Loop,std::vector<Vector3<double>,std::allocator<Vector3<double>>>&,S2Debug&>
                  ((absl *)&local_f8,
                   (vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)local_d8,&local_29)
        ;
        std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>::operator=(puStack_28,&local_f8);
        std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>::~unique_ptr(&local_f8);
      }
      local_ec = 1;
      std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::~vector
                ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)local_d8);
    }
  }
  return (bool)(str_local.length_._7_1_ & 1);
}

Assistant:

bool MakeLoop(string_view str, unique_ptr<S2Loop>* loop,
              S2Debug debug_override) {
  if (str == "empty") {
    *loop = make_unique<S2Loop>(S2Loop::kEmpty());
    return true;
  }
  if (str == "full") {
    *loop = make_unique<S2Loop>(S2Loop::kFull());
    return true;
  }
  vector<S2Point> vertices;
  if (!ParsePoints(str, &vertices)) return false;
  *loop = make_unique<S2Loop>(vertices, debug_override);
  return true;
}